

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.h
# Opt level: O0

void __thiscall KDIS::PDU::Header6::Header6(Header6 *this,Header6 *param_1)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  Header6 *param_1_local;
  Header6 *this_local;
  
  this->_vptr_Header6 = (_func_int **)&PTR__Header6_0032f000;
  KVar1 = param_1->m_ui8ExerciseID;
  KVar2 = param_1->m_ui8PDUType;
  KVar3 = param_1->m_ui8ProtocolFamily;
  this->m_ui8ProtocolVersion = param_1->m_ui8ProtocolVersion;
  this->m_ui8ExerciseID = KVar1;
  this->m_ui8PDUType = KVar2;
  this->m_ui8ProtocolFamily = KVar3;
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeStamp,&param_1->m_TimeStamp);
  KVar1 = param_1->m_ui8Padding1;
  KVar2 = param_1->m_ui8Padding2;
  this->m_ui16PDULength = param_1->m_ui16PDULength;
  this->m_ui8Padding1 = KVar1;
  this->m_ui8Padding2 = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT Header6
{
protected:

    KUINT8 m_ui8ProtocolVersion;

    KUINT8 m_ui8ExerciseID;

    KUINT8 m_ui8PDUType;

    KUINT8 m_ui8ProtocolFamily;

    KDIS::DATA_TYPE::TimeStamp m_TimeStamp;

    KUINT16 m_ui16PDULength;

    KUINT8 m_ui8Padding1;  // Padding except for Live Entity family which uses it for Sub protocol Number, if DIS version > 6 then used for sub protocol.

    KUINT8 m_ui8Padding2;

public:

    static const KUINT16 HEADER6_PDU_SIZE = 12;

    Header6();

    Header6(KDataStream &stream) noexcept(false);

    Header6( KDIS::DATA_TYPE::ENUMS::ProtocolVersion PV, KUINT8 ExerciseID, KDIS::DATA_TYPE::ENUMS::PDUType PT,
             KDIS::DATA_TYPE::ENUMS::ProtocolFamily PF, const KDIS::DATA_TYPE::TimeStamp & TS, KUINT16 PDULength );

    virtual ~Header6();

    //************************************
    // FullName:    KDIS::PDU::Header6::SetProtocolVersion
    //              KDIS::PDU::Header6::GetProtocolVersion
    // Description: DIS protocol version.
    //              In KDIS the version is automatically set by each PDU
    //              to the mimimum version of DIS required to support the current PDU.
    // Parameter:   ProtocolVersion PV
    //************************************
    void SetProtocolVersion( KDIS::DATA_TYPE::ENUMS::ProtocolVersion PV );
    KDIS::DATA_TYPE::ENUMS::ProtocolVersion GetProtocolVersion() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::SetExerciseID
    //              KDIS::PDU::Header6::GetExerciseID
    // Description: Unique to each exercise being
    //              conducted simultaneously.
    // Parameter:   KUINT8 ID
    //************************************
    void SetExerciseID( KUINT8 EID );
    KUINT8 GetExerciseID() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::SetPDUType
    //              KDIS::PDU::Header6::GetPDUType
    // Description: The type of PDU. Set by PDU automatically.
    //              Only change if you know what you are doing.
    // Parameter:   PDUType Type
    //************************************
    void SetPDUType( KDIS::DATA_TYPE::ENUMS::PDUType Type );
    KDIS::DATA_TYPE::ENUMS::PDUType GetPDUType() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::SetProtocolFamily
    //              KDIS::PDU::Header6::GetProtocolFamily
    // Description: Family of protocols to which the PDU belongs
    //              Set by PDU automatically.
    //              Only change if you know what you are doing.
    // Parameter:   ProtocolFamily PF
    //************************************
    void SetProtocolFamily( KDIS::DATA_TYPE::ENUMS::ProtocolFamily PF );
    KDIS::DATA_TYPE::ENUMS::ProtocolFamily GetProtocolFamily() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::SetTimeStamp
    //              KDIS::PDU::Header6::GetTimeStamp
    // Description: Specifies the time which the data
    //              in the PDU is valid.
    // Parameter:   const TimeStamp & TS
    //************************************
    void SetTimeStamp( const KDIS::DATA_TYPE::TimeStamp & TS );
    const KDIS::DATA_TYPE::TimeStamp & GetTimeStamp() const;
    KDIS::DATA_TYPE::TimeStamp & GetTimeStamp();

    //************************************
    // FullName:    KDIS::PDU::Header6::SetPDULength
    //              KDIS::PDU::Header6::GetPDULength
    // Description: Specified the length of the PDU
    //              in KOCTETs( 8 bits = 1 octet ). This value
    //              will be set by each PDU, you should
    //              not have to set this value manually.
    // Parameter:   KUINT16 PDUL
    //************************************
    void SetPDULength( KUINT16 PDUL );
    KUINT16 GetPDULength() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::GetAsString
    // Description: Returns a string representation of the PDU.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::PDU::Header6::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    // Parameter:   bool ignoreHeader = false - Decode the header from the stream?
    //************************************
    virtual void Decode(KDataStream &stream, bool ignoreHeader = false) noexcept(false);

    //************************************
    // FullName:    KDIS::PDU::Header6::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    friend KDataStream & operator >> ( KDataStream & stream, Header6 * H )
    {
        H->Decode( stream );
        return stream;
    };

    friend KDataStream & operator << ( KDataStream & stream, Header6 * H )
    {
        H->Encode( stream );
        return stream;
    };

    KBOOL operator == ( const Header6 & Value ) const;
    KBOOL operator != ( const Header6 & Value ) const;
}